

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
format_uint<1u,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          int num_digits,bool upper)

{
  type tVar1;
  char *buffer_00;
  char local_88 [8];
  char buffer [65];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned_long value_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (out,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    format_uint<1u,char,unsigned_long>(local_88,value,num_digits,upper);
    out_local = copy_str<char,_char_*,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_0>
                          (local_88,local_88 + num_digits,out);
  }
  else {
    format_uint<1u,char,unsigned_long>(buffer_00,value,num_digits,upper);
    out_local.container = out.container;
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_local.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}